

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_intern(sexp ctx,char *str,sexp_sint_t len)

{
  byte bVar1;
  sexp_tag_t *psVar2;
  int iVar3;
  ushort **ppuVar4;
  sexp psVar5;
  long lVar6;
  sexp psVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  sexp local_50;
  sexp_gc_var_t __sexp_gc_preserver1;
  
  local_50 = (sexp)&DAT_0000043e;
  __sexp_gc_preserver1.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver1.next = (sexp_gc_var_t *)0x0;
  if (len < 0) {
    len = strlen(str);
  }
  if ((sexp)len != (sexp)0x0) {
    ppuVar4 = __ctype_b_loc();
    bVar1 = *str;
    if ((*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 8) == 0) {
      if (bVar1 == 0x2b) {
        if (len < 2) {
LAB_0010ef09:
          psVar5 = (sexp)0x0;
          psVar7 = (sexp)0x0;
          if (0 < len) {
            psVar7 = (sexp)len;
          }
          uVar11 = 0;
          uVar8 = 4;
          while( true ) {
            if (psVar7 == psVar5) {
              return (sexp)(uVar11 + 6);
            }
            bVar1 = str[(long)psVar5];
            if ((char)bVar1 < '!') break;
            if ((((bVar1 - 0x23 < 0x3a) &&
                 ((0x200000000000801U >> ((ulong)(bVar1 - 0x23) & 0x3f) & 1) != 0)) ||
                (bVar1 == 0x7c)) ||
               ((""[bVar1] != '\0' || (uVar10 = huff_table[bVar1].len + uVar8, 0x40 < uVar10))))
            break;
            uVar11 = uVar11 | (ulong)huff_table[bVar1].bits << ((byte)uVar8 & 0x3f);
            psVar5 = (sexp)((long)&psVar5->tag + 1);
            uVar8 = uVar10;
          }
          pcVar9 = str + (long)psVar5;
          goto LAB_0010efbb;
        }
      }
      else if (len < 2 || bVar1 != 0x2d) goto LAB_0010ef09;
    }
  }
  psVar5 = (sexp)0x0;
  uVar11 = 0;
  pcVar9 = str;
LAB_0010efbb:
  for (lVar6 = 0; len - (long)psVar5 != lVar6; lVar6 = lVar6 + 1) {
    uVar11 = (long)pcVar9[lVar6] ^ uVar11 * 0x1000193;
  }
  psVar2 = &((((ctx->value).type.setters)->value).type.cpl)->tag + (uVar11 % 0x185) * 2;
  while ((psVar2 = *(sexp_tag_t **)(psVar2 + 4), ((ulong)psVar2 & 3) == 0 && (*psVar2 == 6))) {
    psVar7 = (((anon_union_24768_35_b8e82fc1_for_value *)(psVar2 + 2))->type).name;
    if (((psVar7->value).type.name == (sexp)len) &&
       (iVar3 = strncmp(str,(psVar7->value).flonum_bits + 8,len), iVar3 == 0)) {
      return psVar7;
    }
  }
  __sexp_gc_preserver1.var = &local_50;
  __sexp_gc_preserver1.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &__sexp_gc_preserver1;
  psVar7 = sexp_c_string(ctx,str,len);
  if ((((ulong)psVar7 & 3) == 0) && (psVar7->tag == 0x13)) {
    return psVar7;
  }
  local_50 = (psVar7->value).type.name;
  local_50->tag = 7;
  sexp_push_op(ctx,(sexp_conflict *)
                   ((long)&((((ctx->value).type.setters)->value).type.cpl)->value +
                   (uVar11 % 0x185) * 8 + 8),local_50);
  (ctx->value).context.saves = __sexp_gc_preserver1.next;
  return local_50;
}

Assistant:

sexp sexp_intern(sexp ctx, const char *str, sexp_sint_t len) {
#if SEXP_USE_HUFF_SYMS
  struct sexp_huff_entry he;
  sexp_sint_t space, newbits;
  char c;
#endif
  sexp ls, tmp;
  sexp_gc_var1(sym);
  sexp_sint_t bucket=0;
#if (SEXP_USE_HASH_SYMS || SEXP_USE_HUFF_SYMS)
  sexp_sint_t i=0, res=FNV_OFFSET_BASIS;
  const char *p=str;
#endif

  if (len < 0) len = strlen(str);

#if SEXP_USE_HUFF_SYMS
  res = 0;
  space = SEXP_IMMEDIATE_BITS;
  if (len == 0 || sexp_isdigit((unsigned char)p[0])
      || ((p[0] == '+' || p[0] == '-') && len > 1))
    goto normal_intern;
  for ( ; i<len; i++, p++) {
    c = *p;
    if ((unsigned char)c <= 32 || (unsigned char)c > 127 || c == '\\' || c == '|' || c == '.' || c =='#' || sexp_is_separator(c))
      goto normal_intern;
    he = huff_table[(unsigned char)c];
    newbits = he.len;
    if ((space+newbits) > (sizeof(sexp)*8))
      goto normal_intern;
    res |= (((sexp_uint_t) he.bits) << space);
    space += newbits;
  }
  return (sexp) (res + SEXP_ISYMBOL_TAG);

 normal_intern:
#endif
#if SEXP_USE_HASH_SYMS
  bucket = (sexp_string_hash(p, len-i, res) % SEXP_SYMBOL_TABLE_SIZE);
#endif
  for (ls=sexp_context_symbols(ctx)[bucket]; sexp_pairp(ls); ls=sexp_cdr(ls))
    if ((sexp_lsymbol_length(tmp=sexp_car(ls)) == len)
        && ! strncmp(str, sexp_lsymbol_data(tmp), len))
      return sexp_car(ls);

  /* not found, make a new symbol */
  sexp_gc_preserve1(ctx, sym);
  sym = sexp_c_string(ctx, str, len);
  if (sexp_exceptionp(sym)) return sym;
#if ! SEXP_USE_PACKED_STRINGS
  sym = sexp_string_bytes(sym);
#endif
  sexp_pointer_tag(sym) = SEXP_SYMBOL;
  sexp_push(ctx, sexp_context_symbols(ctx)[bucket], sym);
  sexp_gc_release1(ctx);
  return sym;
}